

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_storage.cpp
# Opt level: O2

void __thiscall
duckdb::LocalStorage::LocalMerge(LocalStorage *this,DataTable *table,RowGroupCollection *collection)

{
  DuckTransaction *transaction;
  bool bVar1;
  LocalTableStorage *this_00;
  RowGroupCollection *pRVar2;
  idx_t val;
  row_t base_id;
  ErrorData error;
  allocator local_d9;
  string local_d8;
  long local_b8;
  ErrorData local_b0;
  
  this_00 = LocalTableManager::GetOrCreateStorage(&this->table_manager,this->context,table);
  bVar1 = TableIndexList::Empty(&this_00->append_indexes);
  if (!bVar1) {
    pRVar2 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->(&this_00->row_groups);
    val = RowGroupCollection::GetTotalRows(pRVar2);
    local_b8 = NumericCastImpl<long,_unsigned_long,_false>::Convert(val);
    local_b8 = local_b8 + 0x7ffffffffff080;
    transaction = this->transaction;
    DataTable::GetTypes((vector<duckdb::LogicalType,_true> *)&local_d8,table);
    LocalTableStorage::AppendToIndexes
              (&local_b0,this_00,transaction,collection,&this_00->append_indexes,
               (vector<duckdb::LogicalType,_true> *)&local_d8,&local_b8);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_d8);
    if (local_b0.initialized == true) {
      ::std::__cxx11::string::string((string *)&local_d8,anon_var_dwarf_4b0ffdd + 9,&local_d9);
      ErrorData::Throw(&local_b0,&local_d8);
    }
    ErrorData::~ErrorData(&local_b0);
  }
  pRVar2 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->(&this_00->row_groups);
  RowGroupCollection::MergeStorage
            (pRVar2,collection,(optional_ptr<duckdb::DataTable,_true>)0x0,
             (optional_ptr<duckdb::StorageCommitState,_true>)0x0);
  this_00->merged_storage = true;
  return;
}

Assistant:

void LocalStorage::LocalMerge(DataTable &table, RowGroupCollection &collection) {
	auto &storage = table_manager.GetOrCreateStorage(context, table);
	if (!storage.append_indexes.Empty()) {
		// append data to indexes if required
		row_t base_id = MAX_ROW_ID + NumericCast<row_t>(storage.row_groups->GetTotalRows());
		auto error =
		    storage.AppendToIndexes(transaction, collection, storage.append_indexes, table.GetTypes(), base_id);
		if (error.HasError()) {
			error.Throw();
		}
	}
	storage.row_groups->MergeStorage(collection, nullptr, nullptr);
	storage.merged_storage = true;
}